

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_func_vararg(jit_State *J)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long in_RDI;
  BCReg vframe;
  BCReg fixargs;
  BCReg s;
  GCproto *pt;
  TraceError in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  lVar1 = *(long *)(in_RDI + 0x80);
  uVar2 = *(uint *)(in_RDI + 0x94) + 1;
  if (0xf9 < *(int *)(in_RDI + 0x98) + uVar2 + (uint)*(byte *)(lVar1 + 7)) {
    lj_trace_err((jit_State *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x88) + (ulong)*(uint *)(in_RDI + 0x94) * 4) =
       *(undefined4 *)(*(long *)(in_RDI + 0x88) + -4);
  if ((uint)*(byte *)(lVar1 + 6) < *(uint *)(in_RDI + 0x94)) {
    uVar3 = (uint)*(byte *)(lVar1 + 6);
  }
  else {
    uVar3 = *(uint *)(in_RDI + 0x94);
  }
  for (local_14 = 0; local_14 < uVar3; local_14 = local_14 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + (ulong)(uVar2 + local_14) * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x88) + (ulong)local_14 * 4);
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + (ulong)local_14 * 4) = 0x7fff;
  }
  *(uint *)(in_RDI + 0x94) = uVar3;
  *(int *)(in_RDI + 0xe4) = *(int *)(in_RDI + 0xe4) + 1;
  *(ulong *)(in_RDI + 0x88) = *(long *)(in_RDI + 0x88) + (ulong)uVar2 * 4;
  *(uint *)(in_RDI + 0x98) = uVar2 + *(int *)(in_RDI + 0x98);
  return;
}

Assistant:

static void rec_func_vararg(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, fixargs, vframe = J->maxslot+1+LJ_FR2;
  lj_assertJ((pt->flags & PROTO_VARARG), "FUNCV in non-vararg function");
  if (J->baseslot + vframe + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  J->base[vframe-1-LJ_FR2] = J->base[-1-LJ_FR2];  /* Copy function up. */
#if LJ_FR2
  J->base[vframe-1] = TREF_FRAME;
#endif
  /* Copy fixarg slots up and set their original slots to nil. */
  fixargs = pt->numparams < J->maxslot ? pt->numparams : J->maxslot;
  for (s = 0; s < fixargs; s++) {
    J->base[vframe+s] = J->base[s];
    J->base[s] = TREF_NIL;
  }
  J->maxslot = fixargs;
  J->framedepth++;
  J->base += vframe;
  J->baseslot += vframe;
}